

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic128.h
# Opt level: O0

void atomic16_set(Int128 *ptr,Int128 val)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  undefined1 cmp_00 [16];
  undefined1 new [16];
  Int128 *pIVar7;
  undefined8 uVar8;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  Int128 *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined1 uStack_58;
  undefined1 uStack_57;
  undefined1 uStack_56;
  undefined1 uStack_55;
  undefined1 uStack_54;
  undefined1 uStack_53;
  undefined1 uStack_52;
  undefined1 uStack_51;
  Int128 cmp;
  Int128 old;
  Int128 val_local;
  Int128 *ptr_local;
  
  cmp._8_8_ = *(Int128 **)ptr;
  old._0_8_ = *(undefined8 *)((long)ptr + 8);
  do {
    uVar8 = (undefined8)old;
    pIVar7 = cmp._8_8_;
    cmp_00._8_8_ = in_stack_ffffffffffffff80;
    cmp_00._0_8_ = in_stack_ffffffffffffff78;
    new._8_8_ = in_RDX;
    new._0_8_ = in_RSI;
    in_stack_ffffffffffffff78 = atomic16_cmpxchg(ptr,cmp._8_8_,(Int128)cmp_00,(Int128)new);
    cmp._8_1_ = (char)in_stack_ffffffffffffff78;
    cmp._9_1_ = (char)((ulong)in_stack_ffffffffffffff78 >> 8);
    cmp._10_1_ = (char)((ulong)in_stack_ffffffffffffff78 >> 0x10);
    cmp._11_1_ = (char)((ulong)in_stack_ffffffffffffff78 >> 0x18);
    cmp._12_1_ = (char)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    cmp._13_1_ = (char)((ulong)in_stack_ffffffffffffff78 >> 0x28);
    cmp._14_1_ = (char)((ulong)in_stack_ffffffffffffff78 >> 0x30);
    cmp._15_1_ = (char)((ulong)in_stack_ffffffffffffff78 >> 0x38);
    old._0_1_ = (char)extraout_RDX;
    old._1_1_ = (char)((ulong)extraout_RDX >> 8);
    old._2_1_ = (char)((ulong)extraout_RDX >> 0x10);
    old._3_1_ = (char)((ulong)extraout_RDX >> 0x18);
    old._4_1_ = (char)((ulong)extraout_RDX >> 0x20);
    old._5_1_ = (char)((ulong)extraout_RDX >> 0x28);
    old._6_1_ = (char)((ulong)extraout_RDX >> 0x30);
    old._7_1_ = (char)((ulong)extraout_RDX >> 0x38);
    uStack_58 = (char)pIVar7;
    uStack_57 = (char)((ulong)pIVar7 >> 8);
    uStack_56 = (char)((ulong)pIVar7 >> 0x10);
    uStack_55 = (char)((ulong)pIVar7 >> 0x18);
    uStack_54 = (char)((ulong)pIVar7 >> 0x20);
    uStack_53 = (char)((ulong)pIVar7 >> 0x28);
    uStack_52 = (char)((ulong)pIVar7 >> 0x30);
    uStack_51 = (char)((ulong)pIVar7 >> 0x38);
    cmp._0_1_ = (char)uVar8;
    cmp._1_1_ = (char)((ulong)uVar8 >> 8);
    cmp._2_1_ = (char)((ulong)uVar8 >> 0x10);
    cmp._3_1_ = (char)((ulong)uVar8 >> 0x18);
    cmp._4_1_ = (char)((ulong)uVar8 >> 0x20);
    cmp._5_1_ = (char)((ulong)uVar8 >> 0x28);
    cmp._6_1_ = (char)((ulong)uVar8 >> 0x30);
    cmp._7_1_ = (char)((ulong)uVar8 >> 0x38);
    cVar9 = -(cmp._10_1_ == uStack_56);
    cVar10 = -(cmp._11_1_ == uStack_55);
    cVar11 = -(cmp._12_1_ == uStack_54);
    cVar12 = -(cmp._13_1_ == uStack_53);
    cVar13 = -(cmp._14_1_ == uStack_52);
    cVar14 = -(cmp._15_1_ == uStack_51);
    cVar15 = -((char)old == (char)cmp);
    cVar16 = -(old._1_1_ == cmp._1_1_);
    cVar17 = -(old._2_1_ == cmp._2_1_);
    cVar18 = -(old._3_1_ == cmp._3_1_);
    cVar19 = -(old._4_1_ == cmp._4_1_);
    cVar20 = -(old._5_1_ == cmp._5_1_);
    cVar21 = -(old._6_1_ == cmp._6_1_);
    bVar22 = -(old._7_1_ == cmp._7_1_);
    auVar1[1] = -(cmp._9_1_ == uStack_57);
    auVar1[0] = -(cmp._8_1_ == uStack_58);
    auVar1[2] = cVar9;
    auVar1[3] = cVar10;
    auVar1[4] = cVar11;
    auVar1[5] = cVar12;
    auVar1[6] = cVar13;
    auVar1[7] = cVar14;
    auVar1[8] = cVar15;
    auVar1[9] = cVar16;
    auVar1[10] = cVar17;
    auVar1[0xb] = cVar18;
    auVar1[0xc] = cVar19;
    auVar1[0xd] = cVar20;
    auVar1[0xe] = cVar21;
    auVar1[0xf] = bVar22;
    auVar2[1] = -(cmp._9_1_ == uStack_57);
    auVar2[0] = -(cmp._8_1_ == uStack_58);
    auVar2[2] = cVar9;
    auVar2[3] = cVar10;
    auVar2[4] = cVar11;
    auVar2[5] = cVar12;
    auVar2[6] = cVar13;
    auVar2[7] = cVar14;
    auVar2[8] = cVar15;
    auVar2[9] = cVar16;
    auVar2[10] = cVar17;
    auVar2[0xb] = cVar18;
    auVar2[0xc] = cVar19;
    auVar2[0xd] = cVar20;
    auVar2[0xe] = cVar21;
    auVar2[0xf] = bVar22;
    auVar6[1] = cVar10;
    auVar6[0] = cVar9;
    auVar6[2] = cVar11;
    auVar6[3] = cVar12;
    auVar6[4] = cVar13;
    auVar6[5] = cVar14;
    auVar6[6] = cVar15;
    auVar6[7] = cVar16;
    auVar6[8] = cVar17;
    auVar6[9] = cVar18;
    auVar6[10] = cVar19;
    auVar6[0xb] = cVar20;
    auVar6[0xc] = cVar21;
    auVar6[0xd] = bVar22;
    auVar5[1] = cVar11;
    auVar5[0] = cVar10;
    auVar5[2] = cVar12;
    auVar5[3] = cVar13;
    auVar5[4] = cVar14;
    auVar5[5] = cVar15;
    auVar5[6] = cVar16;
    auVar5[7] = cVar17;
    auVar5[8] = cVar18;
    auVar5[9] = cVar19;
    auVar5[10] = cVar20;
    auVar5[0xb] = cVar21;
    auVar5[0xc] = bVar22;
    auVar4[1] = cVar12;
    auVar4[0] = cVar11;
    auVar4[2] = cVar13;
    auVar4[3] = cVar14;
    auVar4[4] = cVar15;
    auVar4[5] = cVar16;
    auVar4[6] = cVar17;
    auVar4[7] = cVar18;
    auVar4[8] = cVar19;
    auVar4[9] = cVar20;
    auVar4[10] = cVar21;
    auVar4[0xb] = bVar22;
    auVar3[1] = cVar13;
    auVar3[0] = cVar12;
    auVar3[2] = cVar14;
    auVar3[3] = cVar15;
    auVar3[4] = cVar16;
    auVar3[5] = cVar17;
    auVar3[6] = cVar18;
    auVar3[7] = cVar19;
    auVar3[8] = cVar20;
    auVar3[9] = cVar21;
    auVar3[10] = bVar22;
    in_stack_ffffffffffffff80 = extraout_RDX;
    cmp._8_8_ = in_stack_ffffffffffffff78;
    old._0_8_ = extraout_RDX;
  } while ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                    (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                    (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                    (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                    (ushort)((byte)(CONCAT19(bVar22,CONCAT18(cVar21,CONCAT17(cVar20,CONCAT16(cVar19,
                                                  CONCAT15(cVar18,CONCAT14(cVar17,CONCAT13(cVar16,
                                                  CONCAT12(cVar15,CONCAT11(cVar14,cVar13))))))))) >>
                                   7) & 1) << 6 |
                    (ushort)((byte)(CONCAT18(bVar22,CONCAT17(cVar21,CONCAT16(cVar20,CONCAT15(cVar19,
                                                  CONCAT14(cVar18,CONCAT13(cVar17,CONCAT12(cVar16,
                                                  CONCAT11(cVar15,cVar14)))))))) >> 7) & 1) << 7 |
                   (ushort)(bVar22 >> 7) << 0xf) != 0xffff);
  return;
}

Assistant:

static inline void atomic16_set(Int128 *ptr, Int128 val)
{
    Int128 old = *ptr, cmp;
    do {
        cmp = old;
        old = atomic16_cmpxchg(ptr, cmp, val);
#ifdef _MSC_VER
    } while (memcmp(&old, &cmp, sizeof(old)));
#else
    }